

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O2

uint32_t spvtools::opt::getScalarElementCount(Type *type)

{
  Kind KVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  while (KVar1 = type->kind_, KVar1 == kMatrix) {
    iVar2 = (*type->_vptr_Type[0x10])();
    type = *(Type **)(CONCAT44(extraout_var,iVar2) + 0x28);
  }
  if (KVar1 == kVector) {
    iVar2 = (*type->_vptr_Type[0xe])();
    uVar3 = *(uint32_t *)(CONCAT44(extraout_var_00,iVar2) + 0x30);
  }
  else {
    if (KVar1 == kStruct) {
      __assert_fail("0 && \"getScalarElementCount() does not recognized struct types\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/struct_packing_pass.cpp"
                    ,0x94,"uint32_t spvtools::opt::getScalarElementCount(const analysis::Type &)");
    }
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

static uint32_t getScalarElementCount(const analysis::Type& type) {
  switch (type.kind()) {
    case analysis::Type::kVector:
      return type.AsVector()->element_count();
    case analysis::Type::kMatrix:
      return getScalarElementCount(*type.AsMatrix()->element_type());
    case analysis::Type::kStruct:
      assert(0 && "getScalarElementCount() does not recognized struct types");
      return 0;
    default:
      return 1;
  }
}